

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O1

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
::Persistent_cohomology
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_default> *cpx,bool persistence_dim_max)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  size_t __n;
  out_of_range *this_00;
  allocator_type local_43;
  allocator_type local_42;
  allocator_type local_41 [9];
  value_type local_38;
  
  this->cpx_ = cpx;
  if (cpx->dimension_to_be_lowered_ == true) {
    Simplex_tree<Gudhi::Simplex_tree_options_default>::lower_upper_bound_dimension(cpx);
  }
  this->dim_max_ = cpx->dimension_;
  (this->coeff_field_).Prime = 0;
  (this->coeff_field_).inverse_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coeff_field_).inverse_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coeff_field_).inverse_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
                  (this->cpx_,&this->cpx_->root_);
  this->num_simplices_ = __n;
  std::vector<int,_std::allocator<int>_>::vector(&this->ds_rank_,__n,local_41);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->ds_parent_,this->num_simplices_,&local_42);
  local_38 = (value_type)0x0;
  std::
  vector<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
  ::vector(&this->ds_repr_,this->num_simplices_,&local_38,&local_43);
  puVar2 = (this->ds_parent_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->dsets_).rank =
       (this->ds_rank_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->dsets_).parent = puVar2;
  *(undefined8 *)
   &(this->cam_).super_type.
    super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    .holder = 0;
  *(node_ptr *)
   ((long)&(this->cam_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 8) = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(this->cam_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = (node_ptr)0x0;
  *(undefined8 *)
   ((long)&(this->cam_).super_type.
           super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = 0;
  *(Cam **)((long)&(this->cam_).super_type.
                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
           + 8) = &this->cam_;
  *(Cam **)((long)&(this->cam_).super_type.
                   super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
           + 0x10) = &this->cam_;
  *(color *)((long)&(this->cam_).super_type.
                    super_bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_false,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase2<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase3<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
            + 0x18) = red_t;
  (this->zero_cocycles_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->zero_cocycles_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->zero_cocycles_)._M_h._M_rehash_policy = 0;
  (this->zero_cocycles_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->zero_cocycles_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->zero_cocycles_)._M_h._M_buckets = &(this->zero_cocycles_)._M_h._M_single_bucket;
  (this->zero_cocycles_)._M_h._M_bucket_count = 1;
  (this->zero_cocycles_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->zero_cocycles_)._M_h._M_element_count = 0;
  (this->zero_cocycles_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->transverse_idx_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->zero_cocycles_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->zero_cocycles_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->persistent_pairs_).
  super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->persistent_pairs_).
  super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->persistent_pairs_).
  super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interval_length_policy).cpx_ = cpx;
  (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (this->interval_length_policy).min_length_ = 0.0;
  (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x38;
  (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  (this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  (this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  if (*(int *)((long)&this->num_simplices_ + 4) == 0) {
    if (persistence_dim_max) {
      this->dim_max_ = this->dim_max_ + 1;
    }
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range
            (this_00,"The number of simplices is more than Simplex_key type numeric limit.");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

explicit Persistent_cohomology(FilteredComplex& cpx, bool persistence_dim_max = false)
      : cpx_(&cpx),
        dim_max_(cpx.dimension()),                       // upper bound on the dimension of the simplices
        coeff_field_(),                                  // initialize the field coefficient structure.
        num_simplices_(cpx_->num_simplices()),           // num_simplices save to avoid to call thrice the function
        ds_rank_(num_simplices_),                        // union-find
        ds_parent_(num_simplices_),                      // union-find
        ds_repr_(num_simplices_, NULL),                  // union-find -> annotation vectors
        dsets_(ds_rank_.data(), ds_parent_.data()),      // union-find
        cam_(),                                          // collection of annotation vectors
        zero_cocycles_(),                                // union-find -> Simplex_key of creator for 0-homology
        transverse_idx_(),                               // key -> row
        persistent_pairs_(),
        interval_length_policy(&cpx, 0),
        column_pool_(),  // memory pools for the CAM
        cell_pool_() {
    if (num_simplices_ > std::numeric_limits<Simplex_key>::max()) {
      // num_simplices must be strictly lower than the limit, because a value is reserved for null_key.
      throw std::out_of_range("The number of simplices is more than Simplex_key type numeric limit.");
    }
    if (persistence_dim_max) {
      ++dim_max_;
    }
  }